

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O0

GenericVecType deqp::gles31::Functional::FboTestUtil::mapDataTypeToGenericVecType(DataType type)

{
  undefined4 local_c;
  DataType type_local;
  
  if (type == TYPE_FLOAT_VEC4) {
    local_c = GENERICVECTYPE_FLOAT;
  }
  else if (type == TYPE_INT_VEC4) {
    local_c = GENERICVECTYPE_INT32;
  }
  else if (type == TYPE_UINT_VEC4) {
    local_c = GENERICVECTYPE_UINT32;
  }
  else {
    local_c = GENERICVECTYPE_LAST;
  }
  return local_c;
}

Assistant:

static rr::GenericVecType mapDataTypeToGenericVecType(glu::DataType type)
{
	switch (type)
	{
		case glu::TYPE_FLOAT_VEC4:	return rr::GENERICVECTYPE_FLOAT;
		case glu::TYPE_INT_VEC4:	return rr::GENERICVECTYPE_INT32;
		case glu::TYPE_UINT_VEC4:	return rr::GENERICVECTYPE_UINT32;
		default:
			DE_ASSERT(DE_FALSE);
			return rr::GENERICVECTYPE_LAST;
	}
}